

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdrawhelper.h
# Opt level: O0

uint32_t interpolate_pixel(uint32_t x,uint32_t a,uint32_t y,uint32_t b)

{
  uint32_t t;
  uint32_t b_local;
  uint32_t y_local;
  uint32_t a_local;
  uint32_t x_local;
  
  return (x & 0xff00ff) * a + (y & 0xff00ff) * b >> 8 & 0xff00ff |
         (x >> 8 & 0xff00ff) * a + (y >> 8 & 0xff00ff) * b & 0xff00ff00;
}

Assistant:

static inline uint32_t interpolate_pixel(uint32_t x, uint32_t a, uint32_t y,
                                         uint32_t b)
{
    uint32_t t = (x & 0xff00ff) * a + (y & 0xff00ff) * b;
    t >>= 8;
    t &= 0xff00ff;
    x = ((x >> 8) & 0xff00ff) * a + ((y >> 8) & 0xff00ff) * b;
    x &= 0xff00ff00;
    x |= t;
    return x;
}